

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SilentEntitySystem *this)

{
  EntityAppearance *pEVar1;
  ostream *poVar2;
  EntityAppearance *this_00;
  KStringStream ss;
  KString KStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"Silent Entity System:\n");
  poVar2 = std::operator<<(poVar2,"Number Of Entities:             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumEnts);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Appearance Records:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumOfAppearanceRecords);
  poVar2 = std::operator<<(poVar2,"\n");
  EntityType::GetAsString_abi_cxx11_(&KStack_1d8,&this->m_EntTyp);
  std::operator<<(poVar2,(string *)&KStack_1d8);
  std::__cxx11::string::~string((string *)&KStack_1d8);
  pEVar1 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_vEA).
                 super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pEVar1; this_00 = this_00 + 1
      ) {
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&KStack_1d8,this_00,&this->m_EntTyp);
    std::operator<<(local_1a8,(string *)&KStack_1d8);
    std::__cxx11::string::~string((string *)&KStack_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString SilentEntitySystem::GetAsString() const
{
    KStringStream ss;

    ss << "Silent Entity System:\n"
       << "Number Of Entities:             " << m_ui16NumEnts               << "\n"
       << "Number Of Appearance Records:   " << m_ui16NumOfAppearanceRecords << "\n"
       << m_EntTyp.GetAsString();

    vector<EntityAppearance>::const_iterator citr = m_vEA.begin();
    vector<EntityAppearance>::const_iterator citrEnd = m_vEA.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString( m_EntTyp );
    }

    return ss.str();
}